

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t path_excluded(archive_match *a,wchar_t mbs,void *pathname)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int *in_RCX;
  undefined4 in_register_00000034;
  match *pmVar3;
  match *pmVar4;
  bool bVar5;
  char *local_30;
  
  if (a == (archive_match *)0x0) {
    return L'\0';
  }
  pmVar4 = (a->inclusions).first;
  if (pmVar4 == (match *)0x0) {
    bVar5 = true;
  }
  else {
    pmVar3 = (match *)0x0;
    do {
      if (pmVar4->matches == 0) {
        wVar2 = match_path_inclusion(a,pmVar4,mbs,in_RCX);
        if (wVar2 != L'\0') {
          if (wVar2 < L'\0') {
            return wVar2;
          }
          pwVar1 = &(a->inclusions).unmatched_count;
          *pwVar1 = *pwVar1 + L'\xffffffff';
          pmVar4->matches = pmVar4->matches + 1;
          pmVar3 = pmVar4;
        }
      }
      pmVar4 = pmVar4->next;
    } while (pmVar4 != (match *)0x0);
    bVar5 = pmVar3 == (match *)0x0;
  }
  pmVar4 = (match *)&a->exclusions;
  do {
    pmVar4 = pmVar4->next;
    if (pmVar4 == (match *)0x0) {
      if ((bVar5) && (pmVar4 = (a->inclusions).first, pmVar4 != (match *)0x0)) {
        do {
          if (0 < pmVar4->matches) {
            wVar2 = match_path_inclusion(a,pmVar4,mbs,in_RCX);
            if (wVar2 != L'\0') {
              if (L'\xffffffff' < wVar2) {
                pmVar4->matches = pmVar4->matches + 1;
                return L'\0';
              }
              return wVar2;
            }
          }
          pmVar4 = pmVar4->next;
        } while (pmVar4 != (match *)0x0);
        return (uint)((a->inclusions).first != (match *)0x0);
      }
      return L'\0';
    }
    wVar2 = archive_mstring_get_mbs(&a->archive,&pmVar4->pattern,&local_30);
    if (wVar2 == L'\0') {
      wVar2 = __archive_pathmatch(local_30,(char *)CONCAT44(in_register_00000034,mbs),L'\x03');
    }
    else {
      in_RCX = __errno_location();
      wVar2 = L'\0';
      if (*in_RCX == 0xc) {
        archive_set_error(&a->archive,0xc,"No memory");
        (a->archive).state = 0x8000;
        return L'\xffffffe2';
      }
    }
  } while (wVar2 == L'\0');
  return wVar2;
}

Assistant:

static int
path_excluded(struct archive_match *a, int mbs, const void *pathname)
{
	struct match *match;
	struct match *matched;
	int r;

	if (a == NULL)
		return (0);

	/* Mark off any unmatched inclusions. */
	/* In particular, if a filename does appear in the archive and
	 * is explicitly included and excluded, then we don't report
	 * it as missing even though we don't extract it.
	 */
	matched = NULL;
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		if (match->matches == 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			a->inclusions.unmatched_count--;
			match->matches++;
			matched = match;
		}
	}

	/* Exclusions take priority */
	for (match = a->exclusions.first; match != NULL;
	    match = match->next){
		r = match_path_exclusion(a, match, mbs, pathname);
		if (r)
			return (r);
	}

	/* It's not excluded and we found an inclusion above, so it's
	 * included. */
	if (matched != NULL)
		return (0);


	/* We didn't find an unmatched inclusion, check the remaining ones. */
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		/* We looked at previously-unmatched inclusions already. */
		if (match->matches > 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			match->matches++;
			return (0);
		}
	}

	/* If there were inclusions, default is to exclude. */
	if (a->inclusions.first != NULL)
	    return (1);

	/* No explicit inclusions, default is to match. */
	return (0);
}